

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall wasm::TranslateToFuzzReader::makeMemoryInit(TranslateToFuzzReader *this)

{
  Random *this_00;
  __uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true> _Var1;
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var2;
  undefined8 uVar3;
  uintptr_t uVar4;
  uintptr_t uVar5;
  uintptr_t uVar6;
  uint32_t uVar7;
  Expression *pEVar8;
  Const *pCVar9;
  Const *pCVar10;
  Expression *pEVar11;
  uint32_t uVar12;
  
  if (this->allowMemory != false) {
    this_00 = &this->random;
    uVar7 = Random::upTo(this_00,(uint32_t)
                                 ((ulong)((long)(this->wasm->dataSegments).
                                                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->wasm->dataSegments).
                                               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
    _Var1.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
    super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
         (this->wasm->dataSegments).
         super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_t.
         super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>;
    uVar3 = *(undefined8 *)
             _Var1.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
             super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    uVar4 = *(uintptr_t *)
             ((long)_Var1.
                    super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                    .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 8);
    uVar12 = *(int *)((long)_Var1.
                            super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                            .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x40)
             - *(int *)((long)_Var1.
                              super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                              .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x38
                       );
    uVar7 = Random::upTo(this_00,uVar12);
    uVar12 = Random::upTo(this_00,uVar12 - uVar7);
    pEVar8 = makePointer(this);
    pCVar9 = Builder::makeConst<int>(&this->builder,uVar7);
    pCVar10 = Builder::makeConst<int>(&this->builder,uVar12);
    _Var2.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    uVar5 = *(uintptr_t *)
             _Var2.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uVar6 = *(uintptr_t *)
             ((long)_Var2.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                    _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pEVar11 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x48,8);
    *(undefined8 *)pEVar11 = 0x24;
    (pEVar11->type).id = 0;
    *(undefined8 *)(pEVar11 + 1) = uVar3;
    pEVar11[1].type.id = uVar4;
    *(Expression **)(pEVar11 + 2) = pEVar8;
    pEVar11[2].type.id = (uintptr_t)pCVar9;
    *(Const **)(pEVar11 + 3) = pCVar10;
    pEVar11[3].type.id = uVar5;
    *(uintptr_t *)(pEVar11 + 4) = uVar6;
    wasm::MemoryInit::finalize();
    return pEVar11;
  }
  pEVar8 = makeTrivial(this,(Type)0x0);
  return pEVar8;
}

Assistant:

Expression* TranslateToFuzzReader::makeMemoryInit() {
  if (!allowMemory) {
    return makeTrivial(Type::none);
  }
  Index segIdx = upTo(wasm.dataSegments.size());
  Name segment = wasm.dataSegments[segIdx]->name;
  size_t totalSize = wasm.dataSegments[segIdx]->data.size();
  size_t offsetVal = upTo(totalSize);
  size_t sizeVal = upTo(totalSize - offsetVal);
  Expression* dest = makePointer();
  Expression* offset = builder.makeConst(int32_t(offsetVal));
  Expression* size = builder.makeConst(int32_t(sizeVal));
  return builder.makeMemoryInit(
    segment, dest, offset, size, wasm.memories[0]->name);
}